

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall t_php_generator::generate_php_doc(t_php_generator *this,ostream *out,t_field *field)

{
  t_field *out_00;
  bool bVar1;
  string *psVar2;
  t_type *type_00;
  ostream *poVar3;
  string local_200;
  string local_1e0;
  t_type *local_1c0;
  t_type *type;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198;
  t_field *local_20;
  t_field *field_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  local_20 = field;
  field_local = (t_field *)out;
  out_local = (ostream *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = t_doc::has_doc(&local_20->super_t_doc);
  if (bVar1) {
    psVar2 = t_doc::get_doc_abi_cxx11_(&local_20->super_t_doc);
    poVar3 = std::operator<<(&local_198,(string *)psVar2);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  type_00 = t_field::get_type(local_20);
  local_1c0 = t_generator::get_true_type(type_00);
  poVar3 = std::operator<<(&local_198,"@var ");
  type_to_phpdoc_abi_cxx11_(&local_1e0,this,local_1c0);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  out_00 = field_local;
  std::__cxx11::stringstream::str();
  generate_php_docstring_comment(this,(ostream *)out_00,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void t_php_generator::generate_php_doc(ostream& out, t_field* field) {
  stringstream ss;

  // prepend free-style doc if available
  if (field->has_doc()) {
    ss << field->get_doc() << endl;
  }

  // append @var tag
  t_type* type = get_true_type(field->get_type());
  ss << "@var " << type_to_phpdoc(type) << endl;

  generate_php_docstring_comment(out, ss.str());
}